

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrSignature *
cfd::core::SchnorrUtil::SignWithNonce
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,Privkey *nonce)

{
  ByteData local_40;
  Privkey *local_28;
  Privkey *nonce_local;
  Privkey *sk_local;
  ByteData256 *msg_local;
  
  local_28 = nonce;
  nonce_local = sk;
  sk_local = (Privkey *)msg;
  msg_local = (ByteData256 *)__return_storage_ptr__;
  Privkey::GetData(&local_40,nonce);
  SignCommon(__return_storage_ptr__,msg,sk,(secp256k1_nonce_function_hardened *)&ConstantNonce,
             &local_40);
  ByteData::~ByteData(&local_40);
  return __return_storage_ptr__;
}

Assistant:

SchnorrSignature SchnorrUtil::SignWithNonce(
    const ByteData256 &msg, const Privkey &sk, const Privkey &nonce) {
  return SignCommon(msg, sk, &ConstantNonce, nonce.GetData());
}